

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonValue *other)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  qint64 local_28;
  QCborContainerPrivate *pQStack_20;
  Type local_18;
  undefined4 uStack_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->value).n = (other->value).n;
  pQVar2 = (other->value).container;
  (other->value).container = (QCborContainerPrivate *)0x0;
  (this->value).container = pQVar2;
  TVar1 = (other->value).t;
  (other->value).t = Undefined;
  (this->value).t = TVar1;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0x117;
  local_28 = (other->value).n;
  (other->value).n = 0;
  pQStack_20 = (other->value).container;
  (other->value).container = (QCborContainerPrivate *)0x0;
  TVar1 = (other->value).t;
  (other->value).t = Null;
  _local_18 = CONCAT44(0xaaaaaaaa,TVar1);
  QCborValue::~QCborValue((QCborValue *)&local_28);
  QCborValue::~QCborValue((QCborValue *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(QJsonValue &&other) noexcept
    : value(std::move(other.value))
{
    other.value = QCborValue(nullptr);
}